

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

void __thiscall rlottie::internal::model::PathData::toPath(PathData *this,VPath *path)

{
  VPointF *p;
  VPointF *pVVar1;
  ulong uVar2;
  ulong uVar3;
  
  VPath::reset(path);
  p = (this->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
      super__Vector_impl_data._M_start;
  pVVar1 = (this->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (p != pVVar1) {
    uVar2 = (long)pVVar1 - (long)p >> 3;
    VPath::reserve(path,uVar2 + 1,uVar2 / 3 + 2);
    pVVar1 = p;
    VPath::moveTo(path,p);
    for (uVar3 = 1; uVar3 < uVar2; uVar3 = uVar3 + 3) {
      pVVar1 = p + 1;
      VPath::cubicTo(path,pVVar1,p + 2,p + 3);
      p = p + 3;
    }
    if (this->mClosed != false) {
      VPath::close(path,(int)pVVar1);
      return;
    }
  }
  return;
}

Assistant:

void toPath(VPath &path) const
    {
        path.reset();

        if (mPoints.empty()) return;

        auto size = mPoints.size();
        auto points = mPoints.data();
        /* reserve exact memory requirement at once
         * ptSize = size + 1(size + close)
         * elmSize = size/3 cubic + 1 move + 1 close
         */
        path.reserve(size + 1, size / 3 + 2);
        path.moveTo(points[0]);
        for (size_t i = 1; i < size; i += 3) {
            path.cubicTo(points[i], points[i + 1], points[i + 2]);
        }
        if (mClosed) path.close();
    }